

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linktimeplugin.hpp
# Opt level: O0

void __thiscall linktimeplugin::RegistrarBase<Animal>::RegistrarBase(RegistrarBase<Animal> *this)

{
  bool bVar1;
  vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>
  *this_00;
  pointer this_01;
  RegistrarBase<Animal> *local_28 [3];
  RegistrarBase<Animal> *local_10;
  RegistrarBase<Animal> *this_local;
  
  this->_vptr_RegistrarBase = (_func_int **)&PTR__RegistrarBase_00108c80;
  local_10 = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&registrars_);
  if (!bVar1) {
    this_00 = (vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>
               *)operator_new(0x18);
    std::
    vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>
    ::vector(this_00);
    std::
    unique_ptr<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>,_std::default_delete<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>_>_>
    ::reset((unique_ptr<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>,_std::default_delete<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>_>_>
             *)&registrars_,this_00);
  }
  this_01 = std::
            unique_ptr<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>,_std::default_delete<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>_>_>
            ::operator->((unique_ptr<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>,_std::default_delete<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>_>_>
                          *)&registrars_);
  local_28[0] = this;
  std::
  vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>
  ::push_back(this_01,local_28);
  return;
}

Assistant:

RegistrarBase() noexcept {
            try {
                if (!registrars_) {
                    registrars_.reset(new std::vector<RegistrarBase<BASE>*>);
                }
                registrars_->push_back(this);
            } catch(...) {}
        }